

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O1

bool s2shapeutil::VisitCrossingEdgePairs
               (S2ShapeIndex *a_index,S2ShapeIndex *b_index,CrossingType type,
               EdgePairVisitor *visitor)

{
  ulong uVar1;
  S2ShapeIndex *pSVar2;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *pcVar3;
  const_reference pvVar4;
  S2ShapeIndexCell *cell;
  S2ShapeIndexCell *cell_00;
  ulong uVar5;
  int iVar6;
  RangeIterator *target;
  RangeIterator *this;
  size_type_conflict sVar7;
  bool bVar8;
  RangeIterator bi;
  RangeIterator ai;
  IndexCrosser ab;
  IndexCrosser ba;
  RangeIterator local_f90;
  RangeIterator local_f78;
  IndexCrosser local_f60;
  IndexCrosser local_7c8;
  
  RangeIterator::RangeIterator(&local_f78,a_index);
  RangeIterator::RangeIterator(&local_f90,b_index);
  anon_unknown_0::IndexCrosser::IndexCrosser(&local_f60,a_index,b_index,type,visitor,false);
  anon_unknown_0::IndexCrosser::IndexCrosser(&local_7c8,b_index,a_index,type,visitor,true);
LAB_0022c9e0:
  do {
    while( true ) {
      uVar1 = *(ulong *)((long)local_f78.it_.iter_._M_t.
                               super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                               .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                               _M_head_impl + 8);
      if ((uVar1 == 0xffffffffffffffff) &&
         (*(long *)((long)local_f90.it_.iter_._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl +
                   8) == -1)) {
        bVar8 = true;
        goto LAB_0022cbaa;
      }
      target = &local_f90;
      this = &local_f78;
      if ((local_f90.range_min_.id_ <= local_f78.range_max_.id_) &&
         (target = &local_f78, this = &local_f90,
         local_f78.range_min_.id_ <= local_f90.range_max_.id_)) break;
      RangeIterator::SeekTo(this,target);
    }
    uVar5 = -*(ulong *)((long)local_f90.it_.iter_._M_t.
                              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                              _M_head_impl + 8) &
            *(ulong *)((long)local_f90.it_.iter_._M_t.
                             super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                             .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                             _M_head_impl + 8);
    bVar8 = (long)((-uVar1 & uVar1) - uVar5) < 0;
    if ((-uVar1 & uVar1) == uVar5 || bVar8) {
      if (!bVar8) {
        pcVar3 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                 S2ShapeIndex::Iterator::cell(&local_f78.it_);
        if (((undefined1  [16])*pcVar3 & (undefined1  [16])0xffffff) != (undefined1  [16])0x0) {
          sVar7 = 0;
          iVar6 = 0;
          do {
            pvVar4 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                     operator[](pcVar3,sVar7);
            iVar6 = iVar6 + (*(uint *)&pvVar4->field_0x4 >> 1);
            sVar7 = sVar7 + 1;
          } while (sVar7 < (*(uint *)pcVar3 & 0xffffff));
          if ((iVar6 != 0) &&
             (pcVar3 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                       S2ShapeIndex::Iterator::cell(&local_f90.it_),
             ((undefined1  [16])*pcVar3 & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
            sVar7 = 0;
            iVar6 = 0;
            do {
              pvVar4 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                       operator[](pcVar3,sVar7);
              iVar6 = iVar6 + (*(uint *)&pvVar4->field_0x4 >> 1);
              sVar7 = sVar7 + 1;
            } while (sVar7 < (*(uint *)pcVar3 & 0xffffff));
            if (iVar6 != 0) {
              cell = S2ShapeIndex::Iterator::cell(&local_f78.it_);
              cell_00 = S2ShapeIndex::Iterator::cell(&local_f90.it_);
              pSVar2 = local_f60.a_index_;
              absl::
              InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
              clear(&local_f60.a_shape_edges_);
              AppendShapeEdges(pSVar2,cell,&local_f60.a_shape_edges_);
              pSVar2 = local_f60.b_index_;
              absl::
              InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
              clear(&local_f60.b_shape_edges_);
              AppendShapeEdges(pSVar2,cell_00,&local_f60.b_shape_edges_);
              bVar8 = anon_unknown_0::IndexCrosser::VisitEdgesEdgesCrossings
                                (&local_f60,&local_f60.a_shape_edges_,&local_f60.b_shape_edges_);
              if (!bVar8) goto LAB_0022cba8;
            }
          }
        }
        RangeIterator::Next(&local_f78);
        RangeIterator::Next(&local_f90);
        goto LAB_0022c9e0;
      }
      bVar8 = anon_unknown_0::IndexCrosser::VisitCrossings(&local_7c8,&local_f90,&local_f78);
    }
    else {
      bVar8 = anon_unknown_0::IndexCrosser::VisitCrossings(&local_f60,&local_f78,&local_f90);
    }
    if (bVar8 == false) {
LAB_0022cba8:
      bVar8 = false;
LAB_0022cbaa:
      absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
      clear(&local_7c8.b_shape_edges_);
      absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
      clear(&local_7c8.a_shape_edges_);
      if (local_7c8.b_cells_.
          super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_7c8.b_cells_.
                        super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      S2CrossingEdgeQuery::~S2CrossingEdgeQuery(&local_7c8.b_query_);
      absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
      clear(&local_f60.b_shape_edges_);
      absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
      clear(&local_f60.a_shape_edges_);
      if (local_f60.b_cells_.
          super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f60.b_cells_.
                        super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      S2CrossingEdgeQuery::~S2CrossingEdgeQuery(&local_f60.b_query_);
      if (local_f90.it_.iter_._M_t.
          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
          (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_f90.it_.iter_._M_t.
                              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                              _M_head_impl + 8))();
      }
      if ((__uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
           )local_f78.it_.iter_._M_t.
            super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
            .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
           )0x0) {
        (**(code **)(*(long *)local_f78.it_.iter_._M_t.
                              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                              _M_head_impl + 8))();
      }
      return bVar8;
    }
  } while( true );
}

Assistant:

bool VisitCrossingEdgePairs(const S2ShapeIndex& a_index,
                            const S2ShapeIndex& b_index,
                            CrossingType type, const EdgePairVisitor& visitor) {
  // We look for S2CellId ranges where the indexes of A and B overlap, and
  // then test those edges for crossings.

  // TODO(ericv): Use brute force if the total number of edges is small enough
  // (using a larger threshold if the S2ShapeIndex is not constructed yet).
  RangeIterator ai(a_index), bi(b_index);
  IndexCrosser ab(a_index, b_index, type, visitor, false);  // Tests A against B
  IndexCrosser ba(b_index, a_index, type, visitor, true);   // Tests B against A
  while (!ai.done() || !bi.done()) {
    if (ai.range_max() < bi.range_min()) {
      // The A and B cells don't overlap, and A precedes B.
      ai.SeekTo(bi);
    } else if (bi.range_max() < ai.range_min()) {
      // The A and B cells don't overlap, and B precedes A.
      bi.SeekTo(ai);
    } else {
      // One cell contains the other.  Determine which cell is larger.
      int64 ab_relation = ai.id().lsb() - bi.id().lsb();
      if (ab_relation > 0) {
        // A's index cell is larger.
        if (!ab.VisitCrossings(&ai, &bi)) return false;
      } else if (ab_relation < 0) {
        // B's index cell is larger.
        if (!ba.VisitCrossings(&bi, &ai)) return false;
      } else {
        // The A and B cells are the same.
        if (ai.cell().num_edges() > 0 && bi.cell().num_edges() > 0) {
          if (!ab.VisitCellCellCrossings(ai.cell(), bi.cell())) return false;
        }
        ai.Next();
        bi.Next();
      }
    }
  }
  return true;
}